

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

shared_ptr<fasttext::Matrix> __thiscall fasttext::FastText::createRandomMatrix(FastText *this)

{
  int32_t iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *in_RSI;
  shared_ptr<fasttext::Matrix> sVar2;
  undefined1 local_39;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  int local_1c;
  
  iVar1 = Dictionary::nwords((Dictionary *)in_RSI[2]);
  local_1c = iVar1 + *(int *)(*in_RSI + 0x70);
  local_38 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<fasttext::DenseMatrix,std::allocator<fasttext::DenseMatrix>,int,int&>
            (a_Stack_30,(DenseMatrix **)&local_38,(allocator<fasttext::DenseMatrix> *)&local_39,
             &local_1c,(int *)(*in_RSI + 0x4c));
  DenseMatrix::uniform((DenseMatrix *)local_38,1.0 / (float)*(int *)(*in_RSI + 0x4c));
  (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_38;
  (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_30[0]._M_pi;
  sVar2.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<fasttext::Matrix>)
         sVar2.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Matrix> FastText::createRandomMatrix() const {
  std::shared_ptr<DenseMatrix> input = std::make_shared<DenseMatrix>(
      dict_->nwords() + args_->bucket, args_->dim);
  input->uniform(1.0 / args_->dim);

  return input;
}